

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readmtm.c
# Opt level: O0

int it_mtm_assemble_pattern(IT_PATTERN *pattern,uchar *track,unsigned_short *sequence,int n_rows)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  IT_ENTRY *entry;
  uchar *t;
  int sample;
  int note;
  int o;
  int n;
  IT_ENTRY *local_48;
  char *local_40;
  int local_2c;
  int local_28;
  int local_4;
  
  *in_RDI = in_ECX;
  in_RDI[1] = in_ECX;
  for (local_28 = 0; local_28 < 0x20; local_28 = local_28 + 1) {
    if (*(short *)(in_RDX + (long)local_28 * 2) != 0) {
      local_40 = (char *)(in_RSI + (int)((*(ushort *)(in_RDX + (long)local_28 * 2) - 1) * 0xc0));
      for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
        if (((*local_40 != '\0') || (local_40[1] != '\0')) || (local_40[2] != '\0')) {
          in_RDI[1] = in_RDI[1] + 1;
        }
        local_40 = local_40 + 3;
      }
    }
  }
  local_48 = (IT_ENTRY *)malloc((long)in_RDI[1] * 7);
  if (local_48 == (IT_ENTRY *)0x0) {
    local_4 = -1;
  }
  else {
    *(IT_ENTRY **)(in_RDI + 2) = local_48;
    for (local_28 = 0; local_28 < in_ECX; local_28 = local_28 + 1) {
      for (local_2c = 0; local_2c < 0x20; local_2c = local_2c + 1) {
        if ((*(short *)(in_RDX + (long)local_2c * 2) != 0) &&
           (((pbVar3 = (byte *)(in_RSI + (int)((*(ushort *)(in_RDX + (long)local_2c * 2) - 1) * 0xc0
                                              + local_28 * 3)), *pbVar3 != 0 || (pbVar3[1] != 0)) ||
            (pbVar3[2] != 0)))) {
          local_48->channel = (uchar)local_2c;
          local_48->mask = '\0';
          bVar1 = *pbVar3;
          uVar2 = (*pbVar3 & 3) << 4 | (int)(uint)pbVar3[1] >> 4;
          if ((int)(uint)bVar1 >> 2 != 0) {
            local_48->mask = local_48->mask | 1;
            local_48->note = (char)((int)(uint)bVar1 >> 2) + '\x18';
          }
          if (uVar2 != 0) {
            local_48->mask = local_48->mask | 2;
            local_48->instrument = (uchar)uVar2;
          }
          _dumb_it_xm_convert_effect(pbVar3[1] & 0xf,(uint)pbVar3[2],local_48,1);
          if (local_48->mask != '\0') {
            local_48 = local_48 + 1;
          }
        }
      }
      local_48->channel = 0xff;
      local_48 = local_48 + 1;
    }
    in_RDI[1] = (int)(((long)local_48 - *(long *)(in_RDI + 2)) / 7);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int it_mtm_assemble_pattern(IT_PATTERN *pattern, const unsigned char * track, const unsigned short * sequence, int n_rows)
{
	int n, o, note, sample;
	const unsigned char * t;
	IT_ENTRY * entry;

	pattern->n_rows = n_rows;
	pattern->n_entries = n_rows;

	for (n = 0; n < 32; n++) {
		if (sequence[n]) {
			t = &track[192 * (sequence[n] - 1)];
			for (o = 0; o < n_rows; o++) {
				if (t[0] || t[1] || t[2]) pattern->n_entries++;
				t += 3;
			}
		}
	}

	entry = malloc(pattern->n_entries * sizeof(*entry));
	if (!entry) return -1;
	pattern->entry = entry;

	for (n = 0; n < n_rows; n++) {
		for (o = 0; o < 32; o++) {
			if (sequence[o]) {
				t = &track[192 * (sequence[o] - 1) + (n * 3)];
				if (t[0] || t[1] || t[2]) {
					entry->channel = o;
					entry->mask = 0;
					note = t[0] >> 2;
					sample = ((t[0] << 4) | (t[1] >> 4)) & 0x3F;

					if (note) {
						entry->mask |= IT_ENTRY_NOTE;
						entry->note = note + 24;
					}

					if (sample) {
						entry->mask |= IT_ENTRY_INSTRUMENT;
						entry->instrument = sample;
					}

					_dumb_it_xm_convert_effect(t[1] & 0xF, t[2], entry, 1);

					if (entry->mask) entry++;
				}
			}
		}
		IT_SET_END_ROW(entry);
		entry++;
	}

	pattern->n_entries = (int)(entry - pattern->entry);

	return 0;
}